

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void print_cpp(duration<double,_std::ratio<1L,_1L>_> t,int n,string_view path,string_view func,
              string_view w,bool b)

{
  ostream *poVar1;
  string local_50 [32];
  
  fs_backend_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,local_50);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,func._M_str,func._M_len);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,path._M_str,path._M_len);
  std::operator<<(poVar1,") = ");
  std::__cxx11::string::~string(local_50);
  if (w._M_len == 0) {
    std::ostream::_M_insert<bool>(true);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,w._M_str,w._M_len);
  }
  std::operator<<((ostream *)&std::cout,": ");
  poVar1 = std::ostream::_M_insert<double>((double)(long)(t.__r * 1000000000.0) / 1000.0);
  std::operator<<(poVar1," us\n");
  return;
}

Assistant:

void print_cpp(std::chrono::duration<double> t, int n, std::string_view path, std::string_view func, std::string_view w, bool b)
{
  std::chrono::nanoseconds ns = std::chrono::duration_cast<std::chrono::nanoseconds>(t);
  double us = static_cast<double>(ns.count()) / 1000.0;
  std::cout << fs_backend() << ": " << n << " x " << func << "(" << path << ") = ";
  if(w.empty())
    std::cout << b;
  else
    std::cout << w;
  std::cout << ": " << us << " us\n";
}